

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::CLUFactorRational::remaxRow(CLUFactorRational *this,int p_row,int len)

{
  U *pUVar1;
  VectorRational *pVVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  pointer pnVar7;
  Dring *pDVar8;
  Dring *pDVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  Dring *pDVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  pUVar1 = &this->u;
  if ((U *)(this->u).row.elem[p_row].next == pUVar1) {
    piVar13 = (this->u).row.max;
    iVar15 = len - piVar13[p_row];
    if (iVar15 <= (int)((ulong)((long)*(pointer *)
                                       ((long)&(this->u).row.val.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(this->u).row.val.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) -
                  (this->u).row.used) goto LAB_001b4287;
    pVVar2 = &(this->u).row.val;
    pDVar14 = (this->u).row.list.next;
    if ((U *)pDVar14 == pUVar1) {
      uVar10 = 0;
    }
    else {
      piVar4 = (this->u).row.idx;
      piVar5 = (this->u).row.len;
      piVar6 = (this->u).row.start;
      uVar12 = 0;
      do {
        iVar15 = pDVar14->idx;
        if (piVar6[iVar15] != (int)uVar12) goto LAB_001b413c;
        uVar10 = (int)uVar12 + piVar5[iVar15];
        uVar12 = (ulong)uVar10;
        piVar13[iVar15] = piVar5[iVar15];
        pDVar14 = pDVar14->next;
      } while ((U *)pDVar14 != pUVar1);
    }
    goto LAB_001b41ee;
  }
  pVVar2 = &(this->u).row.val;
  if (len <= (int)((ulong)((long)*(pointer *)
                                  ((long)&(this->u).row.val.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                          (long)(this->u).row.val.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6) -
             (this->u).row.used) goto LAB_001b4025;
  pDVar14 = (this->u).row.list.next;
  if ((U *)pDVar14 == pUVar1) {
    uVar10 = 0;
  }
  else {
    piVar13 = (this->u).row.idx;
    piVar4 = (this->u).row.len;
    piVar5 = (this->u).row.max;
    piVar6 = (this->u).row.start;
    uVar12 = 0;
    do {
      iVar15 = pDVar14->idx;
      if (piVar6[iVar15] != (int)uVar12) goto LAB_001b3ee5;
      uVar10 = (int)uVar12 + piVar4[iVar15];
      uVar12 = (ulong)uVar10;
      piVar5[iVar15] = piVar4[iVar15];
      pDVar14 = pDVar14->next;
    } while ((U *)pDVar14 != pUVar1);
  }
  goto LAB_001b3f91;
LAB_001b413c:
  do {
    iVar15 = pDVar14->idx;
    iVar11 = piVar6[iVar15];
    lVar16 = (long)iVar11;
    piVar6[iVar15] = (int)uVar12;
    piVar13[iVar15] = piVar5[iVar15];
    iVar15 = piVar5[iVar15];
    if (0 < iVar15) {
      uVar12 = (ulong)(int)uVar12;
      lVar17 = lVar16 << 6;
      lVar18 = uVar12 << 6;
      do {
        piVar4[uVar12] = piVar4[lVar16];
        pnVar7 = (pVVar2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar18),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar17));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar18 + 0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar17 + 0x20));
        lVar16 = lVar16 + 1;
        uVar12 = uVar12 + 1;
        lVar17 = lVar17 + 0x40;
        lVar18 = lVar18 + 0x40;
      } while (lVar16 < iVar15 + iVar11);
    }
    uVar10 = (uint)uVar12;
    pDVar14 = pDVar14->next;
  } while ((U *)pDVar14 != pUVar1);
LAB_001b41ee:
  piVar13 = (this->u).row.max;
  piVar13[this->thedim] = 0;
  (this->u).row.used = uVar10;
  pnVar7 = (this->u).row.val.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar15 = len - piVar13[p_row];
  if (((double)(int)((ulong)((long)*(pointer *)
                                    ((long)&(this->u).row.val.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - (long)pnVar7) >>
                    6) < (double)len + (double)(int)uVar10 * this->rowMemMult) &&
     (iVar11 = len + uVar10 * 2,
     (int)((ulong)((long)*(pointer *)
                          ((long)&(this->u).row.val.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) - (long)pnVar7) >> 6) <
     iVar11)) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(pVVar2,iVar11,true);
    spx_realloc<int*>(&(this->u).row.idx,iVar11);
  }
LAB_001b4287:
  piVar13 = &(this->u).row.used;
  *piVar13 = *piVar13 + iVar15;
  (this->u).row.max[p_row] = len;
  return;
LAB_001b3ee5:
  do {
    iVar15 = pDVar14->idx;
    iVar11 = piVar6[iVar15];
    lVar16 = (long)iVar11;
    piVar6[iVar15] = (int)uVar12;
    piVar5[iVar15] = piVar4[iVar15];
    iVar15 = piVar4[iVar15];
    if (0 < iVar15) {
      uVar12 = (ulong)(int)uVar12;
      lVar17 = lVar16 << 6;
      lVar18 = uVar12 << 6;
      do {
        piVar13[uVar12] = piVar13[lVar16];
        pnVar7 = (pVVar2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar18),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar17));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar18 + 0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value + lVar17 + 0x20));
        lVar16 = lVar16 + 1;
        uVar12 = uVar12 + 1;
        lVar17 = lVar17 + 0x40;
        lVar18 = lVar18 + 0x40;
      } while (lVar16 < iVar15 + iVar11);
    }
    uVar10 = (uint)uVar12;
    pDVar14 = pDVar14->next;
  } while ((U *)pDVar14 != pUVar1);
LAB_001b3f91:
  (this->u).row.max[this->thedim] = 0;
  (this->u).row.used = uVar10;
  pnVar7 = (this->u).row.val.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((double)(int)((ulong)((long)*(pointer *)
                                    ((long)&(this->u).row.val.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - (long)pnVar7) >>
                    6) < (double)len + (double)(int)uVar10 * this->rowMemMult) &&
     (iVar15 = len + uVar10 * 2,
     (int)((ulong)((long)*(pointer *)
                          ((long)&(this->u).row.val.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) - (long)pnVar7) >> 6) <
     iVar15)) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(pVVar2,iVar15,true);
    spx_realloc<int*>(&(this->u).row.idx,iVar15);
  }
LAB_001b4025:
  piVar4 = (this->u).row.idx;
  piVar13 = (this->u).row.start;
  iVar15 = (this->u).row.used;
  iVar11 = piVar13[p_row];
  lVar16 = (long)iVar11;
  iVar3 = (this->u).row.len[p_row];
  piVar13[p_row] = iVar15;
  piVar13 = &(this->u).row.used;
  *piVar13 = *piVar13 + len;
  piVar13 = (this->u).row.max;
  pDVar14 = (this->u).row.elem + p_row;
  piVar13[pDVar14->prev->idx] = piVar13[pDVar14->prev->idx] + piVar13[p_row];
  piVar13[p_row] = len;
  pDVar8 = pDVar14->next;
  pDVar8->prev = pDVar14->prev;
  pDVar14->prev->next = pDVar8;
  pDVar8 = (this->u).row.list.prev;
  pDVar9 = pDVar8->next;
  pDVar14->next = pDVar9;
  pDVar9->prev = pDVar14;
  pDVar14->prev = pDVar8;
  pDVar8->next = pDVar14;
  if (0 < iVar3) {
    piVar13 = piVar4 + iVar15;
    lVar17 = (long)iVar15 << 6;
    lVar18 = lVar16 << 6;
    do {
      pnVar7 = (pVVar2->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar7->m_backend).m_value + lVar17),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar7->m_backend).m_value + lVar18));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar7->m_backend).m_value + lVar17 + 0x20),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar7->m_backend).m_value + lVar18 + 0x20));
      *piVar13 = piVar4[lVar16];
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x40;
      piVar13 = piVar13 + 1;
      lVar18 = lVar18 + 0x40;
    } while (lVar16 < iVar3 + iVar11);
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.val.dim() - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      VectorRational& val = u.row.val;
      Dring* ring;

      if(len > u.row.val.dim() - u.row.used)
      {
         packRows();

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      int* idx = u.row.idx;
      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}